

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::ValidateReadBuffer
          (ShaderStorageBufferObjectBase *this,int x,int y,int w,int h,vec3 *expected)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  int iVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  PixelFormat *pPVar9;
  reference pvVar10;
  float *pfVar11;
  int local_80;
  int local_7c;
  int i;
  int j;
  bool result;
  allocator<tcu::Vector<float,_3>_> local_61;
  undefined1 local_60 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> display;
  vec4 g_color_eps;
  PixelFormat *pixelFormat;
  RenderTarget *renderTarget;
  vec3 *expected_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  ShaderStorageBufferObjectBase *this_local;
  
  pRVar8 = deqp::Context::getRenderContext((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar7 = (*pRVar8->_vptr_RenderContext[4])();
  pPVar9 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar7));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             &display.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             1.0 / (float)(1 << ((byte)pPVar9->redBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar9->greenBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar9->blueBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar9->alphaBits & 0x1f)));
  std::allocator<tcu::Vector<float,_3>_>::allocator(&local_61);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_60,
             (long)(w * h),&local_61);
  std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_61);
  pvVar10 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                      ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       local_60,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,x,y,w,h,0x1907,0x1406,
             pvVar10);
  i._3_1_ = true;
  for (local_7c = 0; local_7c < h; local_7c = local_7c + 1) {
    for (local_80 = 0; local_80 < w; local_80 = local_80 + 1) {
      pvVar10 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
                           )local_60,(long)(local_7c * w + local_80));
      bVar6 = ColorEqual(this,pvVar10,expected,
                         (vec4 *)&display.
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar6) {
        pvVar10 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                  operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_60,(long)(local_7c * w + local_80));
        pfVar11 = tcu::Vector<float,_3>::operator[](pvVar10,0);
        fVar1 = *pfVar11;
        pvVar10 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                  operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_60,(long)(local_7c * w + local_80));
        pfVar11 = tcu::Vector<float,_3>::operator[](pvVar10,1);
        fVar2 = *pfVar11;
        pvVar10 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                  operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_60,(long)(local_7c * w + local_80));
        pfVar11 = tcu::Vector<float,_3>::operator[](pvVar10,2);
        fVar3 = *pfVar11;
        pfVar11 = tcu::Vector<float,_3>::operator[](expected,0);
        fVar4 = *pfVar11;
        pfVar11 = tcu::Vector<float,_3>::operator[](expected,1);
        fVar5 = *pfVar11;
        pfVar11 = tcu::Vector<float,_3>::operator[](expected,2);
        anon_unknown_0::Output
                  ("Color at (%d, %d) is (%f %f %f) should be (%f %f %f).\n",(double)fVar1,
                   (double)fVar2,(double)fVar3,(double)fVar4,(double)fVar5,(double)*pfVar11,
                   (ulong)(uint)(x + local_80),(ulong)(uint)(y + local_7c));
        i._3_1_ = false;
      }
    }
  }
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_60);
  return i._3_1_;
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec3& expected)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		std::vector<vec3> display(w * h);
		glReadPixels(x, y, w, h, GL_RGB, GL_FLOAT, &display[0]);

		bool result = true;
		for (int j = 0; j < h; ++j)
		{
			for (int i = 0; i < w; ++i)
			{
				if (!ColorEqual(display[j * w + i], expected, g_color_eps))
				{
					Output("Color at (%d, %d) is (%f %f %f) should be (%f %f %f).\n", x + i, y + j,
						   display[j * w + i][0], display[j * w + i][1], display[j * w + i][2], expected[0],
						   expected[1], expected[2]);
					result = false;
				}
			}
		}

		return result;
	}